

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

float_t dja::determinant(mat4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  vec4 *pvVar48;
  float_t *pfVar49;
  float_t det;
  float_t c0;
  float_t c1;
  float_t c2;
  float_t c3;
  float_t c4;
  float_t c5;
  float_t s5;
  float_t s4;
  float_t s3;
  float_t s2;
  float_t s1;
  float_t s0;
  mat4 *m_local;
  
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar1 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar2 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar3 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar4 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar5 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar6 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar7 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar8 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar9 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar10 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar11 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar12 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar13 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar14 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar15 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar16 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar17 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar18 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar19 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar20 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar21 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar22 = *pfVar49;
  pvVar48 = mat4::operator[](m,1);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar23 = *pfVar49;
  pvVar48 = mat4::operator[](m,0);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar24 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar25 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar26 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar27 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar28 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar29 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar30 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar31 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar32 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar33 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar34 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar35 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar36 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar37 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar38 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar39 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,3);
  fVar40 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar41 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar42 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar43 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,2);
  fVar44 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar45 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,1);
  fVar46 = *pfVar49;
  pvVar48 = mat4::operator[](m,3);
  pfVar49 = vec4::operator[](pvVar48,0);
  fVar47 = *pfVar49;
  pvVar48 = mat4::operator[](m,2);
  pfVar49 = vec4::operator[](pvVar48,1);
  return (fVar21 * fVar22 + -(fVar23 * fVar24)) * (fVar45 * fVar46 + -(fVar47 * *pfVar49)) +
         -(fVar17 * fVar18 + -(fVar19 * fVar20)) * (fVar41 * fVar42 + -(fVar43 * fVar44)) +
         (fVar13 * fVar14 + -(fVar15 * fVar16)) * (fVar37 * fVar38 + -(fVar39 * fVar40)) +
         (fVar9 * fVar10 + -(fVar11 * fVar12)) * (fVar33 * fVar34 + -(fVar35 * fVar36)) +
         (fVar1 * fVar2 + -(fVar3 * fVar4)) * (fVar25 * fVar26 + -(fVar27 * fVar28)) +
         -((fVar5 * fVar6 + -(fVar7 * fVar8)) * (fVar29 * fVar30 + -(fVar31 * fVar32)));
}

Assistant:

float_t determinant(const mat4& m)
{
    const float_t s0 = M00(m) * M11(m) - M10(m) * M01(m);
    const float_t s1 = M00(m) * M12(m) - M10(m) * M02(m);
    const float_t s2 = M00(m) * M13(m) - M10(m) * M03(m);
    const float_t s3 = M01(m) * M12(m) - M11(m) * M02(m);
    const float_t s4 = M01(m) * M13(m) - M11(m) * M03(m);
    const float_t s5 = M02(m) * M13(m) - M12(m) * M03(m);
    const float_t c5 = M22(m) * M33(m) - M32(m) * M23(m);
    const float_t c4 = M21(m) * M33(m) - M31(m) * M23(m);
    const float_t c3 = M21(m) * M32(m) - M31(m) * M22(m);
    const float_t c2 = M20(m) * M33(m) - M30(m) * M23(m);
    const float_t c1 = M20(m) * M32(m) - M30(m) * M22(m);
    const float_t c0 = M20(m) * M31(m) - M30(m) * M21(m);
    const float_t det = s0 * c5 - s1 * c4 + s2 * c3
                      + s3 * c2 - s4 * c1 + s5 * c0;

    return det;
}